

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_elements_token_from_bytes
              (uchar *entropy,size_t entropy_len,uchar *bytes,size_t bytes_len,uchar *bytes_out,
              size_t len)

{
  int iVar1;
  uchar buff [64];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = -2;
  if ((bytes_out == (uchar *)0x20 && entropy_len == 0x20) &&
      (bytes_len != 0 && entropy != (uchar *)0x0)) {
    local_58 = *(undefined8 *)entropy;
    uStack_50 = *(undefined8 *)(entropy + 8);
    local_48 = *(undefined8 *)(entropy + 0x10);
    uStack_40 = *(undefined8 *)(entropy + 0x18);
    local_38 = *(undefined8 *)bytes;
    uStack_30 = *(undefined8 *)(bytes + 8);
    local_28 = *(undefined8 *)(bytes + 0x10);
    uStack_20 = *(undefined8 *)(bytes + 0x18);
    iVar1 = wally_sha256_midstate((uchar *)&local_58,0x40,(uchar *)bytes_len,0x20);
    wally_clear(&local_58,0x40);
  }
  return iVar1;
}

Assistant:

static int tx_elements_token_from_bytes(const unsigned char *entropy,
                                        size_t entropy_len,
                                        const unsigned char *bytes,
                                        size_t bytes_len,
                                        unsigned char *bytes_out,
                                        size_t len)
{
    unsigned char buff[2 * SHA256_LEN];
    int ret;

    if (!entropy || entropy_len != SHA256_LEN ||
        !bytes_len || bytes_len != SHA256_LEN ||
        !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    memcpy(buff, entropy, entropy_len);
    memcpy(buff + SHA256_LEN, bytes, bytes_len);

    ret = wally_sha256_midstate(buff, sizeof(buff), bytes_out, len);
    wally_clear(buff, sizeof(buff));

    return ret;
}